

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O1

void __thiscall
libchess::Position::generate_quiet_moves(Position *this,MoveList *move_list,Color stm)

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Move local_54;
  Position *local_50;
  ulong local_48;
  long local_40;
  Color local_34;
  
  generate_pawn_quiets(this,move_list,stm);
  local_40 = (long)(int)stm.super_MetaValueType<int>.value_;
  uVar12 = this->piece_type_bb_[1].value_ & this->color_bb_[local_40].value_;
  local_50 = this;
  local_34.super_MetaValueType<int>.value_ = stm.super_MetaValueType<int>.value_;
  if (uVar12 != 0) {
    uVar17 = this->color_bb_[0].value_;
    uVar16 = this->color_bb_[1].value_;
    do {
      lVar2 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      for (uVar15 = *(ulong *)(lookups::KNIGHT_ATTACKS + lVar2 * 8) & ~(uVar17 | uVar16);
          uVar15 != 0; uVar15 = uVar15 & uVar15 - 1) {
        lVar3 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        local_54.value_ = (int)lVar3 * 0x40 + (int)lVar2 + 0x8000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_54);
        }
        else {
          (iVar1._M_current)->value_ = local_54.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar12 = uVar12 & uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar12 = local_50->piece_type_bb_[2].value_ & local_50->color_bb_[local_40].value_;
  if (uVar12 != 0) {
    uVar17 = local_50->color_bb_[1].value_ | local_50->color_bb_[0].value_;
    local_48 = ~uVar17;
    do {
      lVar2 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar16 = (ulong)(uint)((int)lVar2 * 8);
      uVar15 = *(ulong *)((long)&lookups::NORTHWEST + uVar16) & uVar17 | 0x100000000000000;
      lVar3 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar15 = *(ulong *)((long)&lookups::NORTHEAST + uVar16) & uVar17 | 0x8000000000000000;
      lVar4 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar15 = *(ulong *)(lookups::SOUTHWEST + uVar16) & uVar17 | 1;
      lVar7 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar15 = *(ulong *)(lookups::SOUTHEAST + uVar16) & uVar17 | 0x80;
      lVar8 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      for (uVar16 = ((&lookups::NORTHWEST)[lVar3] ^
                     *(ulong *)((long)&lookups::BISHOP_ATTACKS + uVar16) ^
                     (&lookups::NORTHEAST)[lVar4] ^
                     *(ulong *)(lookups::SOUTHWEST + (uint)((int)lVar7 << 3)) ^
                    *(ulong *)(lookups::SOUTHEAST + (uint)((int)lVar8 << 3))) & local_48;
          uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
        lVar3 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        local_54.value_ = (int)lVar3 * 0x40 + (int)lVar2 + 0x8000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_54);
        }
        else {
          (iVar1._M_current)->value_ = local_54.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar12 = uVar12 & uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar12 = local_50->piece_type_bb_[3].value_ & local_50->color_bb_[local_40].value_;
  if (uVar12 != 0) {
    uVar17 = local_50->color_bb_[1].value_ | local_50->color_bb_[0].value_;
    local_48 = ~uVar17;
    do {
      lVar2 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar16 = (ulong)(uint)((int)lVar2 * 8);
      uVar15 = *(ulong *)((long)&lookups::NORTH + uVar16) & uVar17 | 0x8000000000000000;
      uVar11 = *(ulong *)(lookups::SOUTH + uVar16) & uVar17 | 1;
      uVar13 = *(ulong *)(lookups::WEST + uVar16) & uVar17 | 1;
      uVar14 = *(ulong *)((long)&lookups::EAST + uVar16) & uVar17 | 0x8000000000000000;
      lVar3 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      lVar4 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      lVar7 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      lVar8 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
        }
      }
      for (uVar16 = ((&lookups::NORTH)[lVar3] ^ *(ulong *)((long)&lookups::ROOK_ATTACKS + uVar16) ^
                     *(ulong *)(lookups::SOUTH + (uint)((int)lVar4 << 3)) ^
                     *(ulong *)(lookups::WEST + (uint)((int)lVar7 << 3)) ^ (&lookups::EAST)[lVar8])
                    & local_48; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
        lVar3 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        local_54.value_ = (int)lVar3 * 0x40 + (int)lVar2 + 0x8000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_54);
        }
        else {
          (iVar1._M_current)->value_ = local_54.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar12 = uVar12 & uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar12 = local_50->piece_type_bb_[4].value_ & local_50->color_bb_[local_40].value_;
  if (uVar12 != 0) {
    uVar17 = local_50->color_bb_[1].value_ | local_50->color_bb_[0].value_;
    local_48 = ~uVar17;
    do {
      lVar2 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar16 = (ulong)(uint)((int)lVar2 * 8);
      uVar15 = *(ulong *)((long)&lookups::NORTHWEST + uVar16) & uVar17 | 0x100000000000000;
      lVar3 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar15 = *(ulong *)((long)&lookups::NORTHEAST + uVar16) & uVar17 | 0x8000000000000000;
      lVar4 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar15 = *(ulong *)(lookups::SOUTHWEST + uVar16) & uVar17 | 1;
      lVar7 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar15 = *(ulong *)(lookups::SOUTHEAST + uVar16) & uVar17 | 0x80;
      lVar8 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      uVar15 = *(ulong *)((long)&lookups::NORTH + uVar16) & uVar17 | 0x8000000000000000;
      lVar5 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      uVar15 = *(ulong *)(lookups::SOUTH + uVar16) & uVar17 | 1;
      lVar9 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      uVar15 = *(ulong *)(lookups::WEST + uVar16) & uVar17 | 1;
      lVar10 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      uVar15 = *(ulong *)((long)&lookups::EAST + uVar16) & uVar17 | 0x8000000000000000;
      lVar6 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      for (uVar16 = ((&lookups::NORTHWEST)[lVar3] ^ *(ulong *)(lookups::QUEEN_ATTACKS + uVar16) ^
                     (&lookups::NORTHEAST)[lVar4] ^
                     *(ulong *)(lookups::SOUTHWEST + (uint)((int)lVar7 << 3)) ^
                     *(ulong *)(lookups::SOUTHEAST + (uint)((int)lVar8 << 3)) ^
                     (&lookups::NORTH)[lVar5] ^ *(ulong *)(lookups::SOUTH + (uint)((int)lVar9 << 3))
                     ^ *(ulong *)(lookups::WEST + (uint)((int)lVar10 << 3)) ^
                    (&lookups::EAST)[lVar6]) & local_48; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1)
      {
        lVar3 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        local_54.value_ = (int)lVar3 * 0x40 + (int)lVar2 + 0x8000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_54);
        }
        else {
          (iVar1._M_current)->value_ = local_54.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar12 = uVar12 & uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar12 = local_50->piece_type_bb_[5].value_ & local_50->color_bb_[local_40].value_;
  if (uVar12 != 0) {
    uVar17 = local_50->color_bb_[0].value_;
    uVar16 = local_50->color_bb_[1].value_;
    do {
      lVar2 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      for (uVar15 = (&lookups::KING_ATTACKS)[lVar2] & ~(uVar17 | uVar16); uVar15 != 0;
          uVar15 = uVar15 & uVar15 - 1) {
        lVar3 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        local_54.value_ = (int)lVar3 * 0x40 + (int)lVar2 + 0x8000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_54);
        }
        else {
          (iVar1._M_current)->value_ = local_54.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar12 = uVar12 & uVar12 - 1;
    } while (uVar12 != 0);
  }
  generate_castling(local_50,move_list,local_34);
  return;
}

Assistant:

inline void Position::generate_quiet_moves(MoveList& move_list, Color stm) const {
    generate_pawn_quiets(move_list, stm);
    generate_non_pawn_quiets(constants::KNIGHT, move_list, stm);
    generate_non_pawn_quiets(constants::BISHOP, move_list, stm);
    generate_non_pawn_quiets(constants::ROOK, move_list, stm);
    generate_non_pawn_quiets(constants::QUEEN, move_list, stm);
    generate_non_pawn_quiets(constants::KING, move_list, stm);
    generate_castling(move_list, stm);
}